

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gogoing_util.cpp
# Opt level: O3

int going_parse_config(char *path)

{
  char cVar1;
  long lVar2;
  istream *piVar3;
  iterator iVar4;
  int iVar5;
  string *psVar6;
  string word;
  string line;
  fstream infile;
  stringstream stream;
  key_type local_408;
  undefined1 *local_3e8;
  undefined8 local_3e0;
  undefined1 local_3d8;
  undefined7 uStack_3d7;
  long local_3c8 [4];
  byte abStack_3a8 [496];
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  going_init_config_keyword_map();
  std::fstream::fstream(local_3c8,path,_S_in);
  local_3e8 = &local_3d8;
  local_3e0 = 0;
  local_3d8 = 0;
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  local_408._M_string_length = 0;
  local_408.field_2._M_local_buf[0] = '\0';
  lVar2 = *(long *)(local_3c8[0] + -0x18);
  if ((abStack_3a8[lVar2] & 5) == 0) {
    while( true ) {
      cVar1 = std::ios::widen((char)&local_408 + (char)lVar2 + '@');
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_3c8,(string *)&local_3e8,cVar1);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::stringstream::stringstream(local_1b8,(string *)&local_3e8,_S_out|_S_in);
      std::operator>>((istream *)local_1b8,(string *)&local_408);
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::find(&going_config_keyword_map_abi_cxx11_._M_t,&local_408);
      if ((_Rb_tree_header *)iVar4._M_node ==
          &going_config_keyword_map_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
        puts("can\'t find keyword.");
LAB_001066b4:
        std::fstream::close();
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base(local_138);
        iVar5 = -1;
        goto LAB_001066e4;
      }
      if (iVar4._M_node[2]._M_color == 2) {
        psVar6 = &going_domain_abi_cxx11_;
      }
      else {
        psVar6 = &going_docroot_abi_cxx11_;
        if (iVar4._M_node[2]._M_color != _S_black) goto LAB_001066b4;
      }
      std::operator>>((istream *)local_1b8,(string *)psVar6);
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      lVar2 = *(long *)(local_3c8[0] + -0x18);
    }
    iVar5 = 0;
    std::fstream::close();
  }
  else {
    printf("%s can\'t open\n",path);
    iVar5 = -1;
    std::fstream::close();
  }
LAB_001066e4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p,
                    CONCAT71(local_408.field_2._M_allocated_capacity._1_7_,
                             local_408.field_2._M_local_buf[0]) + 1);
  }
  if (local_3e8 != &local_3d8) {
    operator_delete(local_3e8,CONCAT71(uStack_3d7,local_3d8) + 1);
  }
  std::fstream::~fstream(local_3c8);
  return iVar5;
}

Assistant:

int going_parse_config(const char *path)
{
	going_init_config_keyword_map();
	fstream infile(path, fstream::in);
	string line, word;
	if(!infile){
		printf("%s can't open\n", path);
		infile.close();
		return -1;
	}
	while(getline(infile, line))
	{
		stringstream stream(line);
		stream >> word;//keyword
		map<string, int>::const_iterator cit = going_config_keyword_map.find(word);
		if(cit == going_config_keyword_map.end()){
			printf("can't find keyword.\n");
			infile.close();
			return -1;
		}
		switch(cit -> second){
			case GOING_DOCROOT:
				stream >> going_docroot;
				break;
			case GOING_DOMAIN:
				stream >> going_domain;
				break;
			default:
				infile.close();
				return -1;
		}
	}
	infile.close();
	return 0;
}